

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::Read
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *this)

{
  TestNLHandler2 *in_RDI;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  reader;
  TextReader<fmt::Locale> bound_reader;
  VarBoundHandler<TestNLHandler2> bound_handler;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff60;
  NLHeader *in_stack_ffffffffffffff68;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff70;
  TextReader<fmt::Locale> local_70;
  VarBoundHandler<TestNLHandler2> local_18;
  
  if ((*(uint *)(in_RDI + 0x18) & 1) == 0) {
    Read((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
         bound_reader.super_ReaderBase.name_.field_2._8_8_,
         (TextReader<fmt::Locale> *)
         bound_reader.super_ReaderBase.name_.field_2._M_allocated_capacity);
  }
  else {
    VarBoundHandler<TestNLHandler2>::VarBoundHandler
              ((VarBoundHandler<TestNLHandler2> *)in_stack_ffffffffffffff60,in_RDI);
    TextReader<fmt::Locale>::TextReader
              (in_stack_ffffffffffffff70,(TextReader<fmt::Locale> *)in_stack_ffffffffffffff68);
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
    ::NLReader((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                *)&stack0xffffffffffffff60,&local_70,*(NLHeader **)(in_RDI + 8),&local_18,
               *(int *)(in_RDI + 0x18));
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
    ::Read((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
            *)bound_reader.super_ReaderBase.name_.field_2._8_8_,
           (TextReader<fmt::Locale> *)
           bound_reader.super_ReaderBase.name_.field_2._M_allocated_capacity);
    Read((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
         bound_reader.super_ReaderBase.name_.field_2._8_8_,
         (TextReader<fmt::Locale> *)
         bound_reader.super_ReaderBase.name_.field_2._M_allocated_capacity);
    TextReader<fmt::Locale>::~TextReader(in_stack_ffffffffffffff60);
    VarBoundHandler<TestNLHandler2>::~VarBoundHandler((VarBoundHandler<TestNLHandler2> *)0x1fa1be);
  }
  TestNLHandler2::EndInput(*(TestNLHandler2 **)(in_RDI + 0x10));
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}